

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall Fn_CallReassign_Test::~Fn_CallReassign_Test(Fn_CallReassign_Test *this)

{
  Fn_CallReassign_Test *this_local;
  
  ~Fn_CallReassign_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Fn, CallReassign) {
	MockParser mock(
		"let a = 3"
		"let b = fn(a) {\n"
		"  let b = a\n"
		"}\n"
		"a = b(4)"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_F, 1, 1);
	INS2(BC_SET_N, 2, 1);
	INS(BC_CALL, 1, 2, 1);
	INS2(BC_MOV, 0, 2);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_MOV, 1, 0);
	INS(BC_RET, 0, 0, 0);
}